

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall
WeightedReservoir_MergeReservoirs_Test::TestBody(WeightedReservoir_MergeReservoirs_Test *this)

{
  char *pcVar1;
  int i;
  long lVar2;
  float fVar3;
  float local_c8 [2];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  AssertionResult gtest_ar;
  float weights [8];
  atomic<int> count [8];
  _Any_data local_60;
  code *local_50;
  code *local_48;
  RNG rng;
  
  pbrt::RNG::SetSequence(&rng,0x1966);
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    fVar3 = pbrt::RNG::Uniform<float>(&rng);
    weights[lVar2] = fVar3 + 0.01;
  }
  local_60._M_unused._M_object = weights;
  local_60._8_8_ = count;
  local_48 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:1054:29)>
             ::_M_invoke;
  count[0].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[1].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[2].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[3].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[4].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[5].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[6].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  count[7].super___atomic_base<int>._M_i = (__atomic_base<int>)0x0;
  local_50 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:1054:29)>
             ::_M_manager;
  pbrt::ParallelFor(0,1000000,(function<void_(long,_long)> *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  fVar3 = 0.0;
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 4) {
    fVar3 = fVar3 + *(float *)((long)weights + lVar2);
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    local_c0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (((double)count[lVar2].super___atomic_base<int>._M_i * 0.98) / 1000000.0);
    local_c8[0] = weights[lVar2] / fVar3;
    testing::internal::CmpHelperLE<double,float>
              ((internal *)&gtest_ar,".98 * count[i] / double(nTrials)","weights[i] / sumW",
               (double *)&local_c0,local_c8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_c0);
      pcVar1 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x43a,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_c0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_c0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (((double)count[lVar2].super___atomic_base<int>._M_i * 1.02) / 1000000.0);
    local_c8[0] = weights[lVar2] / fVar3;
    testing::internal::CmpHelperGE<double,float>
              ((internal *)&gtest_ar,"1.02 * count[i] / double(nTrials)","weights[i] / sumW",
               (double *)&local_c0,local_c8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_c0);
      pcVar1 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x43b,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_c0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(WeightedReservoir, MergeReservoirs) {
    RNG rng(6502);
    constexpr int n = 8;
    float weights[n];
    for (int i = 0; i < n; ++i)
        weights[i] = .01 + rng.Uniform<Float>();

    std::atomic<int> count[n] = {};
    int64_t nTrials = 1000000;
    ParallelFor(0, nTrials, [&](int64_t start, int64_t end) {
#ifdef PBRT_IS_MSVC
        // MSVC2019 doesn't seem to capture this as constexpr...
        constexpr int n = 8;
#endif
        int localCount[n] = {};

        for (int64_t i = start; i < end; ++i) {
            WeightedReservoirSampler<int> wrs0(i);
            WeightedReservoirSampler<int> wrs1(i + 1);

            for (int j = 0; j < n; ++j) {
                if (j & 1)
                    wrs0.Add(j, weights[j]);
                else
                    wrs1.Add(j, weights[j]);
            }

            wrs0.Merge(wrs1);
            ++localCount[wrs0.GetSample()];
        }

        for (int i = 0; i < n; ++i)
            count[i] += localCount[i];
    });

    Float sumW = std::accumulate(std::begin(weights), std::end(weights), Float(0));
    for (int i = 0; i < n; ++i) {
        EXPECT_LE(.98 * count[i] / double(nTrials), weights[i] / sumW);
        EXPECT_GE(1.02 * count[i] / double(nTrials), weights[i] / sumW);
    }
}